

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::CameraSwitcher::CameraSwitcher
          (CameraSwitcher *this,uint64_t id,Element *element,Document *doc,string *name)

{
  int iVar1;
  Scope *this_00;
  Element *el;
  Element *el_00;
  Element *el_01;
  Token *pTVar2;
  allocator local_51;
  string local_50;
  
  NodeAttribute::NodeAttribute(&this->super_NodeAttribute,id,element,doc,name);
  (this->super_NodeAttribute).super_Object._vptr_Object =
       (_func_int **)&PTR__CameraSwitcher_00245f08;
  (this->cameraName)._M_dataplus._M_p = (pointer)&(this->cameraName).field_2;
  (this->cameraName)._M_string_length = 0;
  (this->cameraName).field_2._M_local_buf[0] = '\0';
  (this->cameraIndexName)._M_dataplus._M_p = (pointer)&(this->cameraIndexName).field_2;
  (this->cameraIndexName)._M_string_length = 0;
  (this->cameraIndexName).field_2._M_local_buf[0] = '\0';
  this_00 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)&local_50,"CameraId",&local_51);
  el = Scope::operator[](this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"CameraName",&local_51);
  el_00 = Scope::operator[](this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"CameraIndexName",&local_51);
  el_01 = Scope::operator[](this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (el != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el,0);
    iVar1 = ParseTokenAsInt(pTVar2);
    this->cameraId = iVar1;
  }
  if (el_00 != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el_00,0);
    Token::StringContents_abi_cxx11_(&local_50,pTVar2);
    std::__cxx11::string::operator=((string *)&this->cameraName,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((el_01 != (Element *)0x0) &&
     ((el_01->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (el_01->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    pTVar2 = GetRequiredToken(el_01,0);
    Token::StringContents_abi_cxx11_(&local_50,pTVar2);
    std::__cxx11::string::operator=((string *)&this->cameraIndexName,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

CameraSwitcher::CameraSwitcher(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : NodeAttribute(id,element,doc,name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const CameraId = sc["CameraId"];
    const Element* const CameraName = sc["CameraName"];
    const Element* const CameraIndexName = sc["CameraIndexName"];

    if(CameraId) {
        cameraId = ParseTokenAsInt(GetRequiredToken(*CameraId,0));
    }

    if(CameraName) {
        cameraName = GetRequiredToken(*CameraName,0).StringContents();
    }

    if(CameraIndexName && CameraIndexName->Tokens().size()) {
        cameraIndexName = GetRequiredToken(*CameraIndexName,0).StringContents();
    }
}